

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double nonius::detail::
       weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (int k,int q,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double dVar2;
  double dVar3;
  
  dVar3 = (double)((long)k * (((long)last._M_current - (long)first._M_current >> 3) + -1)) /
          (double)q;
  _Var1._M_current = first._M_current + (int)dVar3;
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (first,_Var1,last);
  dVar2 = *_Var1._M_current;
  if (dVar3 - (double)(int)dVar3 != 0.0) {
    _Var1 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var1._M_current + 1,last._M_current);
    dVar2 = dVar2 + (*_Var1._M_current - dVar2) * (dVar3 - (double)(int)dVar3);
  }
  return dVar2;
}

Assistant:

double weighted_average_quantile(int k, int q, Iterator first, Iterator last) {
            auto count = last - first;
            double idx = (count - 1) * k /static_cast<double>(q);
            int j = static_cast<int>(idx);
            double g = idx - j;
            std::nth_element(first, first+j, last);
            auto xj = first[j];
            if(g == 0) return xj;

            auto xj1 = *std::min_element(first+(j+1), last);
            return xj + g * (xj1 - xj);
        }